

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O3

int gost_pkey_asn1_meths(ENGINE *e,EVP_PKEY_ASN1_METHOD **ameth,int **nids,int nid)

{
  gost_meth_minfo *pgVar1;
  int *piVar2;
  EVP_PKEY_ASN1_METHOD *pEVar3;
  int iVar4;
  
  if (ameth == (EVP_PKEY_ASN1_METHOD **)0x0) {
    piVar2 = known_meths_nids;
    *nids = known_meths_nids;
    iVar4 = 0x32b;
    pgVar1 = gost_meth_array;
    do {
      pgVar1 = pgVar1 + 1;
      *piVar2 = iVar4;
      piVar2 = piVar2 + 1;
      iVar4 = pgVar1->nid;
    } while (iVar4 != 0);
    return 10;
  }
  iVar4 = 0x32b;
  pgVar1 = gost_meth_array;
  do {
    pgVar1 = pgVar1 + 1;
    if (iVar4 == nid) {
      pEVar3 = *pgVar1[-1].ameth;
      iVar4 = 1;
      goto LAB_0010e3c3;
    }
    iVar4 = pgVar1->nid;
  } while (iVar4 != 0);
  pEVar3 = (EVP_PKEY_ASN1_METHOD *)0x0;
  iVar4 = 0;
LAB_0010e3c3:
  *ameth = pEVar3;
  return iVar4;
}

Assistant:

static int gost_pkey_asn1_meths(ENGINE *e, EVP_PKEY_ASN1_METHOD **ameth,
                                const int **nids, int nid)
{
    struct gost_meth_minfo *info;

    if (!ameth)
        return gost_meth_nids(nids);

    for (info = gost_meth_array; info->nid; info++)
        if (nid == info->nid) {
            *ameth = *info->ameth;
            return 1;
        }
    *ameth = NULL;
    return 0;
}